

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbirb.cpp
# Opt level: O1

void __thiscall icu_63::RBBIRuleBuilder::optimizeTables(RBBIRuleBuilder *this)

{
  bool bVar1;
  bool bVar2;
  int32_t iVar3;
  IntPair duplPair;
  IntPair local_28;
  
  do {
    local_28.first = 3;
    local_28.second = 0;
    bVar1 = RBBITableBuilder::findDuplCharClassFrom(this->fForwardTable,&local_28);
    bVar2 = bVar1;
    while (bVar2 != false) {
      RBBISetBuilder::mergeCategories(this->fSetBuilder,local_28);
      RBBITableBuilder::removeColumn(this->fForwardTable,local_28.second);
      bVar2 = RBBITableBuilder::findDuplCharClassFrom(this->fForwardTable,&local_28);
    }
    do {
      bVar2 = bVar1;
      iVar3 = RBBITableBuilder::removeDuplicateStates(this->fForwardTable);
      bVar1 = true;
    } while (0 < iVar3);
  } while (bVar2 != false);
  return;
}

Assistant:

void RBBIRuleBuilder::optimizeTables() {
    bool didSomething;
    do {
        didSomething = false;

        // Begin looking for duplicates with char class 3.
        // Classes 0, 1 and 2 are special; they are unused, {bof} and {eof} respectively,
        // and should not have other categories merged into them.
        IntPair duplPair = {3, 0};
        while (fForwardTable->findDuplCharClassFrom(&duplPair)) {
            fSetBuilder->mergeCategories(duplPair);
            fForwardTable->removeColumn(duplPair.second);
            didSomething = true;
        }

        while (fForwardTable->removeDuplicateStates() > 0) {
            didSomething = true;
        }
    } while (didSomething);
}